

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkInfo.cpp
# Opt level: O1

void __thiscall LinkInfo::parseLinkInfoHeaderSize(LinkInfo *this)

{
  uint uVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_28,&this->LinkInfoHeaderSize);
  uVar1 = Utils::lenFourBytes(&local_28);
  if (local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes. ",8);
  if (uVar1 == 0x1c) {
    pcVar4 = "Offsets to the optional fields are not specified.";
    lVar3 = 0x31;
  }
  else {
    if ((int)uVar1 < 0x24) {
      return;
    }
    pcVar4 = "Offsets to the optional fields are specified.";
    lVar3 = 0x2d;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return;
}

Assistant:

void LinkInfo::parseLinkInfoHeaderSize() {
    int len = Utils::lenFourBytes(LinkInfoHeaderSize);
    cout << dec << len << " bytes. ";
    if (len == 0x0000001C)
        cout << "Offsets to the optional fields are not specified." << endl;
    else if(len >= 0x00000024) {
        cout << "Offsets to the optional fields are specified." << endl;
    }
}